

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O3

void start_pass_huff_decoder(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  jpeg_component_info *pjVar2;
  jpeg_error_mgr *pjVar3;
  bool bVar4;
  long lVar5;
  code *pcVar6;
  code *pcVar7;
  int (*paiVar8) [64];
  int iVar9;
  int iVar10;
  int (*paiVar11) [8];
  long lVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  
  pjVar1 = cinfo->entropy;
  iVar10 = cinfo->Ss;
  if (cinfo->progressive_mode == 0) {
    if ((((iVar10 != 0) || (cinfo->Ah != 0)) || (cinfo->Al != 0)) ||
       ((cinfo->Se < 0x40 || cinfo->is_baseline != 0 && (cinfo->Se != cinfo->lim_Se)))) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x7d;
      (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
    }
    pcVar6 = decode_mcu_sub;
    if (cinfo->lim_Se == 0x3f) {
      pcVar6 = decode_mcu;
    }
    pjVar1->decode_mcu = pcVar6;
    if (0 < cinfo->comps_in_scan) {
      lVar5 = 0;
      do {
        pjVar2 = cinfo->cur_comp_info[lVar5];
        iVar10 = pjVar2->dc_tbl_no;
        jpeg_make_d_derived_tbl(cinfo,1,iVar10,(d_derived_tbl **)(&pjVar1[6].decode_mcu + iVar10));
        if (cinfo->lim_Se != 0) {
          iVar10 = pjVar2->ac_tbl_no;
          jpeg_make_d_derived_tbl(cinfo,0,iVar10,(d_derived_tbl **)(&pjVar1[8].decode_mcu + iVar10))
          ;
        }
        *(undefined4 *)((long)&pjVar1[2].start_pass + lVar5 * 4 + 4) = 0;
        lVar5 = lVar5 + 1;
      } while (lVar5 < cinfo->comps_in_scan);
    }
    if (0 < cinfo->blocks_in_MCU) {
      lVar5 = 0;
      do {
        pjVar2 = cinfo->cur_comp_info[cinfo->MCU_membership[lVar5]];
        (&pjVar1[10].decode_mcu)[lVar5] = (&pjVar1[6].decode_mcu)[pjVar2->dc_tbl_no];
        (&pjVar1[0xf].decode_mcu)[lVar5] = (&pjVar1[8].decode_mcu)[pjVar2->ac_tbl_no];
        iVar10 = 0;
        if (pjVar2->component_needed != 0) {
          iVar10 = pjVar2->DCT_h_scaled_size;
          iVar14 = pjVar2->DCT_v_scaled_size;
          iVar9 = cinfo->lim_Se;
          if (iVar9 < 0xf) {
            if (iVar9 == 0) {
              iVar10 = 1;
              goto LAB_00111786;
            }
            if (iVar9 == 3) {
              iVar9 = 1;
              iVar13 = 1;
              if (0xfffffffd < iVar14 - 3U) {
                iVar13 = iVar14 + -1;
              }
              if (0xfffffffd < iVar10 - 3U) {
                iVar9 = iVar10 + -1;
              }
              lVar12 = (long)iVar9;
              paiVar11 = (int (*) [8])(jpeg_zigzag_order2 + iVar13);
            }
            else {
              if (iVar9 != 8) goto LAB_00111692;
              iVar9 = 2;
              iVar13 = 2;
              if (0xfffffffc < iVar14 - 4U) {
                iVar13 = iVar14 + -1;
              }
              if (0xfffffffc < iVar10 - 4U) {
                iVar9 = iVar10 + -1;
              }
              lVar12 = (long)iVar9;
              paiVar11 = (int (*) [8])(jpeg_zigzag_order3 + iVar13);
            }
          }
          else if (iVar9 < 0x23) {
            if (iVar9 == 0xf) {
              iVar9 = 3;
              iVar13 = 3;
              if (0xfffffffb < iVar14 - 5U) {
                iVar13 = iVar14 + -1;
              }
              if (0xfffffffb < iVar10 - 5U) {
                iVar9 = iVar10 + -1;
              }
              lVar12 = (long)iVar9;
              paiVar11 = (int (*) [8])(jpeg_zigzag_order4 + iVar13);
            }
            else if (iVar9 == 0x18) {
              iVar9 = 4;
              iVar13 = 4;
              if (0xfffffffa < iVar14 - 6U) {
                iVar13 = iVar14 + -1;
              }
              if (0xfffffffa < iVar10 - 6U) {
                iVar9 = iVar10 + -1;
              }
              lVar12 = (long)iVar9;
              paiVar11 = (int (*) [8])(jpeg_zigzag_order5 + iVar13);
            }
            else {
LAB_00111692:
              iVar9 = 7;
              iVar13 = 7;
              if (0xfffffff7 < iVar14 - 9U) {
                iVar13 = iVar14 + -1;
              }
              if (0xfffffff7 < iVar10 - 9U) {
                iVar9 = iVar10 + -1;
              }
              lVar12 = (long)iVar9;
              paiVar11 = jpeg_zigzag_order + iVar13;
            }
          }
          else if (iVar9 == 0x23) {
            iVar9 = 5;
            iVar13 = 5;
            if (0xfffffff9 < iVar14 - 7U) {
              iVar13 = iVar14 + -1;
            }
            if (0xfffffff9 < iVar10 - 7U) {
              iVar9 = iVar10 + -1;
            }
            lVar12 = (long)iVar9;
            paiVar11 = (int (*) [8])(jpeg_zigzag_order6 + iVar13);
          }
          else {
            if (iVar9 != 0x30) goto LAB_00111692;
            iVar9 = 6;
            iVar13 = 6;
            if (0xfffffff8 < iVar14 - 8U) {
              iVar13 = iVar14 + -1;
            }
            if (0xfffffff8 < iVar10 - 8U) {
              iVar9 = iVar10 + -1;
            }
            lVar12 = (long)iVar9;
            paiVar11 = (int (*) [8])(jpeg_zigzag_order7 + iVar13);
          }
          iVar10 = (*paiVar11)[lVar12] + 1;
        }
LAB_00111786:
        *(int *)((long)&pjVar1[0x14].decode_mcu + lVar5 * 4) = iVar10;
        lVar5 = lVar5 + 1;
      } while (lVar5 < cinfo->blocks_in_MCU);
    }
    goto LAB_001119b7;
  }
  iVar14 = cinfo->Se;
  if (iVar10 == 0) {
    if (iVar14 == 0) goto LAB_001117aa;
LAB_001117cb:
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x11;
    (pjVar3->msg_parm).i[0] = iVar10;
    (cinfo->err->msg_parm).i[1] = cinfo->Se;
    (cinfo->err->msg_parm).i[2] = cinfo->Ah;
    (cinfo->err->msg_parm).i[3] = cinfo->Al;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  else {
    if (((iVar14 < iVar10) || (cinfo->lim_Se < iVar14)) || (cinfo->comps_in_scan != 1))
    goto LAB_001117cb;
LAB_001117aa:
    if (cinfo->Ah == 0) {
      iVar14 = cinfo->Al;
    }
    else {
      iVar14 = cinfo->Ah + -1;
      if (iVar14 != cinfo->Al) goto LAB_001117cb;
    }
    if (0xd < iVar14) goto LAB_001117cb;
  }
  bVar4 = false;
  if (0 < cinfo->comps_in_scan) {
    lVar5 = 0;
    do {
      iVar10 = cinfo->cur_comp_info[lVar5]->component_index;
      paiVar8 = cinfo->coef_bits + iVar10;
      iVar14 = cinfo->Ss;
      if (iVar14 == 0) {
        iVar14 = 0;
      }
      else if ((*paiVar8)[0] < 0) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x76;
        (pjVar3->msg_parm).i[0] = iVar10;
        (cinfo->err->msg_parm).i[1] = 0;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
        iVar14 = cinfo->Ss;
      }
      if (iVar14 <= cinfo->Se) {
        lVar12 = (long)iVar14 + -1;
        do {
          iVar9 = (*paiVar8)[lVar12 + 1];
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          if (cinfo->Ah != iVar9) {
            pjVar3 = cinfo->err;
            pjVar3->msg_code = 0x76;
            (pjVar3->msg_parm).i[0] = iVar10;
            (cinfo->err->msg_parm).i[1] = iVar14;
            (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
          }
          (*paiVar8)[lVar12 + 1] = cinfo->Al;
          lVar12 = lVar12 + 1;
          iVar14 = iVar14 + 1;
        } while (lVar12 < cinfo->Se);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < cinfo->comps_in_scan);
    bVar4 = 0 < cinfo->comps_in_scan;
  }
  bVar15 = cinfo->Ss == 0;
  pcVar6 = decode_mcu_AC_first;
  if (bVar15) {
    pcVar6 = decode_mcu_DC_first;
  }
  pcVar7 = decode_mcu_AC_refine;
  if (bVar15) {
    pcVar7 = decode_mcu_DC_refine;
  }
  if (cinfo->Ah == 0) {
    pcVar7 = pcVar6;
  }
  pjVar1->decode_mcu = pcVar7;
  if (bVar4) {
    lVar5 = 0;
    do {
      if (cinfo->Ss == 0) {
        if (cinfo->Ah == 0) {
          iVar10 = cinfo->cur_comp_info[lVar5]->dc_tbl_no;
          jpeg_make_d_derived_tbl(cinfo,1,iVar10,(d_derived_tbl **)(&pjVar1[4].start_pass + iVar10))
          ;
        }
      }
      else {
        iVar10 = cinfo->cur_comp_info[lVar5]->ac_tbl_no;
        jpeg_make_d_derived_tbl(cinfo,0,iVar10,(d_derived_tbl **)(&pjVar1[4].start_pass + iVar10));
        pjVar1[6].start_pass = (&pjVar1[4].start_pass)[iVar10];
      }
      *(undefined4 *)((long)&pjVar1[2].start_pass + lVar5 * 4 + 4) = 0;
      lVar5 = lVar5 + 1;
    } while (lVar5 < cinfo->comps_in_scan);
  }
  *(undefined4 *)&pjVar1[2].start_pass = 0;
LAB_001119b7:
  *(undefined4 *)&pjVar1[1].decode_mcu = 0;
  pjVar1[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
  *(undefined4 *)((long)&pjVar1[3].start_pass + 4) = 0;
  *(uint *)&pjVar1[3].decode_mcu = cinfo->restart_interval;
  return;
}

Assistant:

METHODDEF(void)
start_pass_huff_decoder (j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int ci, blkn, tbl, i;
  jpeg_component_info * compptr;

  if (cinfo->progressive_mode) {
    /* Validate progressive scan parameters */
    if (cinfo->Ss == 0) {
      if (cinfo->Se != 0)
	goto bad;
    } else {
      /* need not check Ss/Se < 0 since they came from unsigned bytes */
      if (cinfo->Se < cinfo->Ss || cinfo->Se > cinfo->lim_Se)
	goto bad;
      /* AC scans may have only one component */
      if (cinfo->comps_in_scan != 1)
	goto bad;
    }
    if (cinfo->Ah != 0) {
      /* Successive approximation refinement scan: must have Al = Ah-1. */
      if (cinfo->Ah-1 != cinfo->Al)
	goto bad;
    }
    if (cinfo->Al > 13) {	/* need not check for < 0 */
      /* Arguably the maximum Al value should be less than 13 for 8-bit precision,
       * but the spec doesn't say so, and we try to be liberal about what we
       * accept.  Note: large Al values could result in out-of-range DC
       * coefficients during early scans, leading to bizarre displays due to
       * overflows in the IDCT math.  But we won't crash.
       */
      bad:
      ERREXIT4(cinfo, JERR_BAD_PROGRESSION,
	       cinfo->Ss, cinfo->Se, cinfo->Ah, cinfo->Al);
    }
    /* Update progression status, and verify that scan order is legal.
     * Note that inter-scan inconsistencies are treated as warnings
     * not fatal errors ... not clear if this is right way to behave.
     */
    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      int coefi, cindex = cinfo->cur_comp_info[ci]->component_index;
      int *coef_bit_ptr = & cinfo->coef_bits[cindex][0];
      if (cinfo->Ss && coef_bit_ptr[0] < 0) /* AC without prior DC scan */
	WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, 0);
      for (coefi = cinfo->Ss; coefi <= cinfo->Se; coefi++) {
	int expected = (coef_bit_ptr[coefi] < 0) ? 0 : coef_bit_ptr[coefi];
	if (cinfo->Ah != expected)
	  WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, coefi);
	coef_bit_ptr[coefi] = cinfo->Al;
      }
    }

    /* Select MCU decoding routine */
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_first;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_refine;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_refine;
    }

    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      compptr = cinfo->cur_comp_info[ci];
      /* Make sure requested tables are present, and compute derived tables.
       * We may build same derived table more than once, but it's not expensive.
       */
      if (cinfo->Ss == 0) {
	if (cinfo->Ah == 0) {	/* DC refinement needs no table */
	  tbl = compptr->dc_tbl_no;
	  jpeg_make_d_derived_tbl(cinfo, TRUE, tbl,
				  & entropy->derived_tbls[tbl]);
	}
      } else {
	tbl = compptr->ac_tbl_no;
	jpeg_make_d_derived_tbl(cinfo, FALSE, tbl,
				& entropy->derived_tbls[tbl]);
	/* remember the single active table */
	entropy->ac_derived_tbl = entropy->derived_tbls[tbl];
      }
      /* Initialize DC predictions to 0 */
      entropy->saved.last_dc_val[ci] = 0;
    }

    /* Initialize private state variables */
    entropy->saved.EOBRUN = 0;
  } else {
    /* Check that the scan parameters Ss, Se, Ah/Al are OK for sequential JPEG.
     * This ought to be an error condition, but we make it a warning because
     * there are some baseline files out there with all zeroes in these bytes.
     */
    if (cinfo->Ss != 0 || cinfo->Ah != 0 || cinfo->Al != 0 ||
	((cinfo->is_baseline || cinfo->Se < DCTSIZE2) &&
	cinfo->Se != cinfo->lim_Se))
      WARNMS(cinfo, JWRN_NOT_SEQUENTIAL);

    /* Select MCU decoding routine */
    /* We retain the hard-coded case for full-size blocks.
     * This is not necessary, but it appears that this version is slightly
     * more performant in the given implementation.
     * With an improved implementation we would prefer a single optimized
     * function.
     */
    if (cinfo->lim_Se != DCTSIZE2-1)
      entropy->pub.decode_mcu = decode_mcu_sub;
    else
      entropy->pub.decode_mcu = decode_mcu;

    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      compptr = cinfo->cur_comp_info[ci];
      /* Compute derived values for Huffman tables */
      /* We may do this more than once for a table, but it's not expensive */
      tbl = compptr->dc_tbl_no;
      jpeg_make_d_derived_tbl(cinfo, TRUE, tbl,
			      & entropy->dc_derived_tbls[tbl]);
      if (cinfo->lim_Se) {	/* AC needs no table when not present */
	tbl = compptr->ac_tbl_no;
	jpeg_make_d_derived_tbl(cinfo, FALSE, tbl,
				& entropy->ac_derived_tbls[tbl]);
      }
      /* Initialize DC predictions to 0 */
      entropy->saved.last_dc_val[ci] = 0;
    }

    /* Precalculate decoding info for each block in an MCU of this scan */
    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      /* Precalculate which table to use for each block */
      entropy->dc_cur_tbls[blkn] = entropy->dc_derived_tbls[compptr->dc_tbl_no];
      entropy->ac_cur_tbls[blkn] = entropy->ac_derived_tbls[compptr->ac_tbl_no];
      /* Decide whether we really care about the coefficient values */
      if (compptr->component_needed) {
	ci = compptr->DCT_v_scaled_size;
	i = compptr->DCT_h_scaled_size;
	switch (cinfo->lim_Se) {
	case (1*1-1):
	  entropy->coef_limit[blkn] = 1;
	  break;
	case (2*2-1):
	  if (ci <= 0 || ci > 2) ci = 2;
	  if (i <= 0 || i > 2) i = 2;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order2[ci - 1][i - 1];
	  break;
	case (3*3-1):
	  if (ci <= 0 || ci > 3) ci = 3;
	  if (i <= 0 || i > 3) i = 3;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order3[ci - 1][i - 1];
	  break;
	case (4*4-1):
	  if (ci <= 0 || ci > 4) ci = 4;
	  if (i <= 0 || i > 4) i = 4;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order4[ci - 1][i - 1];
	  break;
	case (5*5-1):
	  if (ci <= 0 || ci > 5) ci = 5;
	  if (i <= 0 || i > 5) i = 5;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order5[ci - 1][i - 1];
	  break;
	case (6*6-1):
	  if (ci <= 0 || ci > 6) ci = 6;
	  if (i <= 0 || i > 6) i = 6;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order6[ci - 1][i - 1];
	  break;
	case (7*7-1):
	  if (ci <= 0 || ci > 7) ci = 7;
	  if (i <= 0 || i > 7) i = 7;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order7[ci - 1][i - 1];
	  break;
	default:
	  if (ci <= 0 || ci > 8) ci = 8;
	  if (i <= 0 || i > 8) i = 8;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order[ci - 1][i - 1];
	  break;
	}
      } else {
	entropy->coef_limit[blkn] = 0;
      }
    }
  }

  /* Initialize bitread state variables */
  entropy->bitstate.bits_left = 0;
  entropy->bitstate.get_buffer = 0; /* unnecessary, but keeps Purify quiet */
  entropy->insufficient_data = FALSE;

  /* Initialize restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}